

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sensors.cpp
# Opt level: O1

bool __thiscall
iDynTree::SensorsList::removeSensor
          (SensorsList *this,SensorType *sensor_type,ptrdiff_t sensor_index)

{
  pointer *pppSVar1;
  undefined8 *puVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  SensorType SVar4;
  pointer pvVar5;
  long lVar6;
  pointer ppSVar7;
  long lVar8;
  pointer __src;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,long>,std::_Select1st<std::pair<std::__cxx11::string_const,long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,long>>>
  *this_00;
  ulong uVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_90;
  size_type local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
  local_70;
  long *local_48;
  long local_40;
  ptrdiff_t local_38;
  
  SVar4 = *sensor_type;
  pvVar5 = (this->pimpl->allSensors).
           super__Vector_base<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>,_std::allocator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar6 = *(long *)&pvVar5[SVar4].
                    super__Vector_base<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>.
                    _M_impl;
  ppSVar7 = *(pointer *)
             ((long)&pvVar5[SVar4].
                     super__Vector_base<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>.
                     _M_impl + 8);
  lVar8 = (long)ppSVar7 - lVar6 >> 3;
  if (sensor_index < lVar8) {
    pvVar5 = pvVar5 + SVar4;
    puVar2 = (undefined8 *)(lVar6 + sensor_index * 8);
    __src = (pointer)(puVar2 + 1);
    local_48 = (long *)*puVar2;
    local_40 = lVar8;
    if (__src != ppSVar7) {
      memmove((void *)(lVar6 + sensor_index * 8),__src,(long)ppSVar7 - (long)__src);
    }
    pppSVar1 = (pointer *)
               ((long)&(pvVar5->
                       super__Vector_base<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>).
                       _M_impl + 8);
    *pppSVar1 = *pppSVar1 + -1;
    this_00 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,long>,std::_Select1st<std::pair<std::__cxx11::string_const,long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,long>>>
               *)((this->pimpl->sensorsNameToIndex).
                  super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + *sensor_type);
    local_38 = sensor_index;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
    ::clear((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
             *)this_00);
    if (*(pointer *)
         ((long)&(pvVar5->
                 super__Vector_base<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>).
                 _M_impl + 8) !=
        *(pointer *)
         &(pvVar5->super__Vector_base<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>).
          _M_impl) {
      paVar3 = &local_70.first.field_2;
      uVar9 = 0;
      do {
        (**(code **)(**(long **)(*(long *)&(pvVar5->
                                           super__Vector_base<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>
                                           )._M_impl + uVar9 * 8) + 0x10))(&local_90);
        if (local_90 == &local_80) {
          local_70.first.field_2._8_8_ = local_80._8_8_;
          local_70.first._M_dataplus._M_p = (pointer)paVar3;
        }
        else {
          local_70.first._M_dataplus._M_p = (pointer)local_90;
        }
        local_70.first.field_2._M_allocated_capacity._1_7_ = local_80._M_allocated_capacity._1_7_;
        local_70.first.field_2._M_local_buf[0] = local_80._M_local_buf[0];
        local_70.first._M_string_length = local_88;
        local_88 = 0;
        local_80._M_local_buf[0] = '\0';
        local_90 = &local_80;
        local_70.second = uVar9;
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,long>,std::_Select1st<std::pair<std::__cxx11::string_const,long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,long>>>
        ::_M_insert_unique<std::pair<std::__cxx11::string_const,long>>(this_00,&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70.first._M_dataplus._M_p != paVar3) {
          operator_delete(local_70.first._M_dataplus._M_p,
                          local_70.first.field_2._M_allocated_capacity + 1);
        }
        if (local_90 != &local_80) {
          operator_delete(local_90,CONCAT71(local_80._M_allocated_capacity._1_7_,
                                            local_80._M_local_buf[0]) + 1);
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 < (ulong)((long)*(pointer *)
                                      ((long)&(pvVar5->
                                              super__Vector_base<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>
                                              )._M_impl + 8) -
                               *(long *)&(pvVar5->
                                         super__Vector_base<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>
                                         )._M_impl >> 3));
    }
    sensor_index = local_38;
    lVar8 = local_40;
    if (local_48 != (long *)0x0) {
      (**(code **)(*local_48 + 8))();
    }
  }
  return sensor_index < lVar8;
}

Assistant:

bool SensorsList::removeSensor(const SensorType & sensor_type, const std::ptrdiff_t sensor_index)
    {
        std::vector<Sensor*>& typeVector = this->pimpl->allSensors[sensor_type];
        if (sensor_index >= static_cast<std::ptrdiff_t>(typeVector.size())) {
            return false;
        }
        Sensor *s = typeVector[sensor_index];
        typeVector.erase(typeVector.begin() + sensor_index);
        SensorsListPimpl::SensorNameToIndexMap& nameToIndex = this->pimpl->sensorsNameToIndex[sensor_type];
        // We have to rebuild the name->index map as indices have changed
        nameToIndex.clear();
        for (size_t index = 0; index < typeVector.size(); ++index) {
            nameToIndex.insert(SensorsListPimpl::SensorNameToIndexMap::value_type(typeVector[index]->getName(), index));
        }

        delete s;
        return true;
    }